

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct>::ConvertToStruct
          (JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct> *this)

{
  bool bVar1;
  vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *in_RSI;
  PsbtGlobalXpubStruct *in_RDI;
  PsbtGlobalXpubStruct data;
  PsbtGlobalXpub *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct> *__range3;
  vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *result;
  vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
  *in_stack_fffffffffffffe98;
  PsbtGlobalXpubStruct *__x;
  PsbtGlobalXpub *in_stack_ffffffffffffff38;
  __normal_iterator<const_cfd::api::json::PsbtGlobalXpub_*,_std::vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  ::std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>::vector
            ((vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *)0x6c02ce);
  local_28[0]._M_current =
       (PsbtGlobalXpub *)
       ::std::
       vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>::
       begin(in_stack_fffffffffffffe98);
  ::std::vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>::
  end(in_stack_fffffffffffffe98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::json::PsbtGlobalXpub_*,_std::vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_cfd::api::json::PsbtGlobalXpub_*,_std::vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>_>
                             *)in_stack_fffffffffffffe98), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::PsbtGlobalXpub_*,_std::vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>_>
    ::operator*(local_28);
    cfd::api::json::PsbtGlobalXpub::ConvertToStruct(in_stack_ffffffffffffff38);
    ::std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>::push_back
              (in_RSI,__x);
    PsbtGlobalXpubStruct::~PsbtGlobalXpubStruct(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::PsbtGlobalXpub_*,_std::vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>_>
    ::operator++(local_28);
  }
  return (vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *)__x;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }